

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean_array_2_d.cxx
# Opt level: O3

bool __thiscall BooleanArray2D::at(BooleanArray2D *this,uint row,uint col)

{
  uint uVar1;
  out_of_range *this_00;
  
  if (row < this->rows) {
    if (col < this->cols) {
      uVar1 = this->cols * row + col;
      return (this->data[uVar1 >> 3] >> (uVar1 & 7) & 1) != 0;
    }
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this_00,"Column out of range.");
  }
  else {
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this_00,"Row out of range.");
  }
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

bool BooleanArray2D::at(unsigned int row, unsigned int col) const
{
    if(row >= rows) {
        throw std::out_of_range("Row out of range.");
    }
    if(col >= cols) {
        throw std::out_of_range("Column out of range.");
    }

    unsigned int index = row * cols + col;
    unsigned int byte_index = index / 8;
    unsigned int bit_index = index % 8;
    unsigned char byte = data[byte_index];
    //is bit with bit_index is set in byte:
    return (1 == ((byte >> bit_index) & 1U));
}